

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

Gia_Man_t *
Dam_ManAreaBalanceInt
          (Gia_Man_t *pGia,Vec_Int_t *vCiLevels,int nNewNodesMax,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Vec_Que_t *pVVar2;
  int *piVar3;
  int *piVar4;
  float *pfVar5;
  long lVar6;
  int iVar7;
  Dam_Man_t *p;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  timespec ts;
  timespec local_40;
  
  p = Dam_ManAlloc(pGia);
  iVar7 = Gia_ManSetLevels(p->pGia,vCiLevels);
  p->nLevelMax = iVar7;
  pVVar8 = Gia_ManReverseLevel(p->pGia);
  p->vNodLevR = pVVar8;
  iVar7 = 0;
  Vec_IntFillExtra(p->pGia->vLevels,(p->pGia->nObjs * 3) / 2,0);
  Dam_ManCreatePairs(p,fVerbose);
  if (0 < nNewNodesMax) {
    do {
      pVVar2 = p->vQue;
      iVar14 = pVVar2->nSize;
      if (iVar14 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      fVar17 = -1e+09;
      if (iVar14 != 1) {
        if (*pVVar2->pCostsFlt == (float *)0x0) {
          fVar17 = (float)pVVar2->pHeap[1];
        }
        else {
          fVar17 = (*pVVar2->pCostsFlt)[pVVar2->pHeap[1]];
        }
      }
      if (fVar17 < 2.0) break;
      if (iVar14 == 1) {
        __assert_fail("p->nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xed,"int Vec_QuePop(Vec_Que_t *)");
      }
      piVar3 = pVVar2->pHeap;
      piVar4 = pVVar2->pOrder;
      iVar14 = piVar3[1];
      piVar4[iVar14] = -1;
      iVar11 = pVVar2->nSize;
      pVVar2->nSize = iVar11 + -1;
      if (iVar11 + -1 == 1) {
        piVar3[1] = -1;
      }
      else {
        iVar1 = piVar3[(long)iVar11 + -1];
        piVar3[(long)iVar11 + -1] = -1;
        piVar3[1] = iVar1;
        piVar4[iVar1] = 1;
        pfVar5 = *pVVar2->pCostsFlt;
        if (pfVar5 == (float *)0x0) {
          fVar17 = (float)iVar1;
        }
        else {
          fVar17 = pfVar5[iVar1];
        }
        iVar11 = pVVar2->nSize;
        uVar10 = 1;
        if (2 < iVar11) {
          uVar12 = 2;
          uVar10 = 1;
          do {
            uVar13 = uVar12 | 1;
            uVar15 = uVar12;
            if ((int)uVar13 < iVar11) {
              if (pfVar5 == (float *)0x0) {
                fVar18 = (float)piVar3[(int)uVar12];
              }
              else {
                fVar18 = pfVar5[piVar3[(int)uVar12]];
              }
              if (pfVar5 == (float *)0x0) {
                fVar19 = (float)piVar3[(int)uVar13];
              }
              else {
                fVar19 = pfVar5[piVar3[(int)uVar13]];
              }
              if (fVar18 < fVar19) {
                uVar15 = uVar13;
              }
            }
            if (iVar11 <= (int)uVar15) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar11 = piVar3[(int)uVar15];
            if (pfVar5 == (float *)0x0) {
              fVar18 = (float)iVar11;
            }
            else {
              fVar18 = pfVar5[iVar11];
            }
            if (fVar18 <= fVar17) break;
            piVar3[(int)uVar10] = iVar11;
            piVar4[iVar11] = uVar10;
            uVar12 = uVar15 * 2;
            iVar11 = pVVar2->nSize;
            uVar10 = uVar15;
          } while ((int)uVar12 < iVar11);
        }
        piVar3[(int)uVar10] = iVar1;
        piVar4[iVar1] = uVar10;
      }
      if (fVeryVerbose != 0) {
        Dam_PrintDiv(p,iVar14);
      }
      Dam_ManUpdate(p,iVar14);
      iVar7 = iVar7 + 1;
    } while (iVar7 != nNewNodesMax);
  }
  if (fVeryVerbose != 0) {
    Dam_PrintDiv(p,0);
  }
  pGVar9 = Dam_ManMultiAig(p);
  if (fVerbose != 0) {
    iVar7 = p->vHash->vObjs->nSize;
    iVar14 = iVar7 + 3;
    if (-1 < iVar7) {
      iVar14 = iVar7;
    }
    uVar15 = (iVar14 >> 2) - 1;
    uVar10 = p->nDivs;
    printf("Div:  ");
    uVar12 = 1;
    if (1 < (int)uVar15) {
      uVar12 = uVar15;
    }
    printf("  Total =%9d (%6.2f %%) ",((double)(int)uVar15 * 100.0) / (double)(int)uVar12,
           (ulong)uVar15);
    printf("  Used =%9d (%6.2f %%)",((double)(int)uVar10 * 100.0) / (double)(int)uVar12,
           (ulong)uVar10);
    iVar7 = 1;
    if (1 < p->nAnds) {
      iVar7 = p->nAnds;
    }
    printf("  Gain =%6d (%6.2f %%)",((double)p->nGain * 100.0) / (double)iVar7);
    printf("  GainX = %d  ",(ulong)(uint)p->nGainX);
    iVar14 = 3;
    iVar7 = clock_gettime(3,&local_40);
    if (iVar7 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    lVar6 = p->clkStart;
    Abc_Print(iVar14,"%s =","Time");
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar16 - lVar6) / 1000000.0);
  }
  Dam_ManFree(p);
  return pGVar9;
}

Assistant:

Gia_Man_t * Dam_ManAreaBalanceInt( Gia_Man_t * pGia, Vec_Int_t * vCiLevels, int nNewNodesMax, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew;
    Dam_Man_t * p;
    int i, iDiv;
    p = Dam_ManAlloc( pGia );
    p->nLevelMax = Gia_ManSetLevels( p->pGia, vCiLevels );
    p->vNodLevR = Gia_ManReverseLevel( p->pGia );
    Vec_IntFillExtra( p->pGia->vLevels, 3*Gia_ManObjNum(p->pGia)/2, 0 );
    Dam_ManCreatePairs( p, fVerbose );
    for ( i = 0; i < nNewNodesMax && Vec_QueTopPriority(p->vQue) >= 2; i++ )
    {
        iDiv = Vec_QuePop(p->vQue);
        if ( fVeryVerbose )
            Dam_PrintDiv( p, iDiv );
        Dam_ManUpdate( p, iDiv );
    }
    if ( fVeryVerbose )
        Dam_PrintDiv( p, 0 );
    pNew = Dam_ManMultiAig( p );
    if ( fVerbose )
    {
        int nDivsAll = Hash_IntManEntryNum(p->vHash);
        int nDivsUsed = p->nDivs;
        printf( "Div:  " );
        printf( "  Total =%9d (%6.2f %%) ",   nDivsAll,   100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
        printf( "  Used =%9d (%6.2f %%)",     nDivsUsed,  100.0 * nDivsUsed   / Abc_MaxInt(nDivsAll, 1) );
        printf( "  Gain =%6d (%6.2f %%)",     p->nGain,   100.0 * p->nGain / Abc_MaxInt(p->nAnds, 1) );
        printf( "  GainX = %d  ",             p->nGainX  );
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    Dam_ManFree( p );
    return pNew;
}